

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

int utils::mkdir(char *__path,__mode_t __mode)

{
  int iVar1;
  istream *piVar2;
  long *extraout_RAX;
  long *plVar3;
  string currentPath;
  string dirName;
  stat st;
  stringstream ss;
  allocator local_2a9;
  long *local_2a8;
  long local_2a0;
  long local_298 [2];
  undefined1 *local_288;
  undefined8 local_280;
  undefined1 local_278;
  undefined7 uStack_277;
  long *local_268 [2];
  long local_258 [2];
  stat local_248;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  local_2a8 = local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"");
  local_288 = &local_278;
  local_280 = 0;
  local_278 = 0;
  std::__cxx11::string::string((string *)&local_248,__path,&local_2a9);
  std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_248,_S_out|_S_in);
  if ((__nlink_t *)local_248.st_dev != &local_248.st_nlink) {
    operator_delete((void *)local_248.st_dev,local_248.st_nlink + 1);
  }
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1b8,(string *)&local_288,'/');
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::string::_M_append((char *)&local_2a8,(ulong)local_288);
    local_268[0] = local_258;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_268,local_2a8,(long)local_2a8 + local_2a0);
    iVar1 = stat((char *)local_268[0],&local_248);
    if ((iVar1 == 0) && ((local_248.st_mode & 0x4000) != 0)) {
      if (local_268[0] != local_258) {
        operator_delete(local_268[0],local_258[0] + 1);
      }
    }
    else {
      iVar1 = ::mkdir((char *)local_2a8,0x1fd);
      if (local_268[0] != local_258) {
        operator_delete(local_268[0],local_258[0] + 1);
      }
      if (iVar1 != 0) break;
    }
    std::__cxx11::string::append((char *)&local_2a8);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  if (local_288 != &local_278) {
    operator_delete(local_288,CONCAT71(uStack_277,local_278) + 1);
  }
  plVar3 = local_298;
  if (local_2a8 != plVar3) {
    operator_delete(local_2a8,local_298[0] + 1);
    plVar3 = extraout_RAX;
  }
  return (int)plVar3;
}

Assistant:

static inline int mkdir(const char *path) {
  std::string currentPath = "";
  std::string dirName;
  std::stringstream ss(path);

  while (std::getline(ss, dirName, '/')) {
    currentPath += dirName;
    if (!dirExists(currentPath) && _mkdir(currentPath.c_str()) != 0) {
      return -1;
    }
    currentPath += "/";
  }
  return 0;
}